

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = this->current_;
  do {
    pcVar2 = pcVar3 + 1;
    if (pcVar3 == this->end_) break;
    this->current_ = pcVar2;
    cVar1 = *pcVar3;
    pcVar3 = pcVar2;
  } while ((cVar1 != '*') || (*pcVar2 != '/'));
  if (pcVar3 == this->end_) {
    return false;
  }
  this->current_ = pcVar3 + 1;
  return *pcVar3 == '/';
}

Assistant:

bool 
Reader::readCStyleComment()
{
   while ( current_ != end_ )
   {
      Char c = getNextChar();
      if ( c == '*'  &&  *current_ == '/' )
         break;
   }
   return getNextChar() == '/';
}